

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void update_output(EPSG *psg)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  byte bVar5;
  uint8_t uVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = psg->base_count + psg->base_incr;
  psg->base_count = uVar1 & 0xffffff;
  for (uVar2 = psg->env_count + (uVar1 >> 0x18); 0xffff < uVar2;
      uVar2 = (uVar2 - psg->env_freq) - (uint)(psg->env_freq == 0)) {
    if (psg->env_pause == '\0') {
      if (psg->env_face == '\0') {
        bVar5 = psg->env_ptr - 1;
      }
      else {
        bVar5 = psg->env_ptr + 1;
      }
      bVar5 = bVar5 & 0x3f;
      psg->env_ptr = bVar5;
    }
    else {
      bVar5 = psg->env_ptr;
    }
    if ((bVar5 & 0x20) != 0) {
      if (psg->env_continue == '\0') {
        psg->env_pause = '\x01';
        uVar6 = '\0';
      }
      else {
        if (psg->env_alternate != psg->env_hold) {
          psg->env_face = psg->env_face ^ 1;
        }
        if (psg->env_hold != '\0') {
          psg->env_pause = '\x01';
        }
        uVar6 = '\0';
        if (psg->env_face == '\0') {
          uVar6 = '\x1f';
        }
      }
      psg->env_ptr = uVar6;
    }
  }
  psg->env_count = uVar2;
  bVar5 = (byte)(uVar1 >> 0x18);
  bVar3 = psg->noise_count + bVar5;
  psg->noise_count = bVar3;
  uVar1 = psg->noise_seed;
  if ((bVar3 & 0x40) != 0) {
    uVar8 = uVar1 >> 1;
    uVar2 = uVar1 & 1;
    uVar1 = uVar8 ^ 0x12000;
    if (uVar2 == 0) {
      uVar1 = uVar8;
    }
    psg->noise_seed = uVar1;
    uVar6 = '\x02';
    if (psg->noise_freq != '\0') {
      uVar6 = psg->noise_freq;
    }
    psg->noise_count = bVar3 - uVar6;
  }
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    uVar7 = psg->count[lVar4] + (ushort)bVar5;
    psg->count[lVar4] = uVar7;
    if ((uVar7 >> 0xc & 1) != 0) {
      if (psg->freq[lVar4] < 2) {
        psg->edge[lVar4] = '\x01';
      }
      else {
        psg->edge[lVar4] = psg->edge[lVar4] == '\0';
        psg->count[lVar4] = psg->count[lVar4] - psg->freq[lVar4];
      }
    }
    psg->ch_out[lVar4] = 0;
    if ((((psg->mask >> ((uint)lVar4 & 0x1f) & 1) == 0) &&
        ((psg->tmask[lVar4] != '\0' || (psg->edge[lVar4] != '\0')))) &&
       ((psg->nmask[lVar4] != '\0' || ((uVar1 & 1) != 0)))) {
      if ((psg->volume[lVar4] & 0x20) == 0) {
        uVar9 = (ulong)(psg->volume[lVar4] & 0x1f);
      }
      else {
        uVar9 = (ulong)psg->env_ptr;
      }
      psg->ch_out[lVar4] = (int16_t)(psg->voltbl[uVar9] << 5);
    }
  }
  return;
}

Assistant:

static void update_output(EOPLL *opll) {
  int16_t *out;
  int i;

  update_ampm(opll);
  update_short_noise(opll);
  update_slots(opll);

  out = opll->ch_out;
  // prevent DC offset when muting channels mid-playback
  memset(out, 0, 14 * sizeof(int16_t));

  /* CH1-6 */
  for (i = 0; i < 6; i++) {
    if (!(opll->mask & EOPLL_MASK_CH(i))) {
      out[i] = _MO(calc_slot_car(opll, i, calc_slot_mod(opll, i)));
    }
  }

  /* CH7 */
  if (!opll->rhythm_mode) {
    if (!(opll->mask & EOPLL_MASK_CH(6))) {
      out[6] = _MO(calc_slot_car(opll, 6, calc_slot_mod(opll, 6)));
    }
  } else {
    if (!(opll->mask & EOPLL_MASK_BD)) {
      out[9] = _RO(calc_slot_car(opll, 6, calc_slot_mod(opll, 6)));
    }
  }
  update_noise(opll, 14);

  /* CH8 */
  if (!opll->rhythm_mode) {
    if (!(opll->mask & EOPLL_MASK_CH(7))) {
      out[7] = _MO(calc_slot_car(opll, 7, calc_slot_mod(opll, 7)));
    }
  } else {
    if (!(opll->mask & EOPLL_MASK_HH)) {
      out[10] = _RO(calc_slot_hat(opll));
    }
    if (!(opll->mask & EOPLL_MASK_SD)) {
      out[11] = _RO(calc_slot_snare(opll));
    }
  }
  update_noise(opll, 2);

  /* CH9 */
  if (!opll->rhythm_mode) {
    if (!(opll->mask & EOPLL_MASK_CH(8))) {
      out[8] = _MO(calc_slot_car(opll, 8, calc_slot_mod(opll, 8)));
    }
  } else {
    if (!(opll->mask & EOPLL_MASK_TOM)) {
      out[12] = _RO(calc_slot_tom(opll));
    }
    if (!(opll->mask & EOPLL_MASK_CYM)) {
      out[13] = _RO(calc_slot_cym(opll));
    }
  }
  update_noise(opll, 2);
}